

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildWithDepsLogTestStraightforward::Run(BuildWithDepsLogTestStraightforward *this)

{
  Test *pTVar1;
  pointer ppNVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  LoadStatus LVar7;
  TimeStamp TVar8;
  Node *pNVar9;
  size_type sVar10;
  allocator<char> local_6c1;
  string local_6c0;
  undefined1 local_6a0 [8];
  Builder builder_1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  undefined1 local_578 [8];
  DepsLog deps_log_1;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  ManifestParserOptions local_4c8;
  int local_4c0;
  int local_4bc;
  int fail_count_3;
  int fail_count_2;
  State state_1;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  undefined1 local_2c0 [8];
  Builder builder;
  string local_1e0;
  undefined1 local_1c0 [8];
  DepsLog deps_log;
  int fail_count_1;
  int fail_count;
  undefined1 local_140 [8];
  State state;
  char *manifest;
  string err;
  BuildWithDepsLogTestStraightforward *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&manifest);
  state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x204132;
  State::State((State *)local_140);
  iVar5 = testing::Test::AssertionFailures(g_current_test);
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,(State *)local_140);
  iVar6 = testing::Test::AssertionFailures(g_current_test);
  if (iVar5 == iVar6) {
    iVar5 = testing::Test::AssertionFailures(g_current_test);
    ppNVar2 = state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ManifestParserOptions::ManifestParserOptions
              ((ManifestParserOptions *)
               &deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    AssertParse((State *)local_140,(char *)ppNVar2,
                (ManifestParserOptions)
                deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar6 = testing::Test::AssertionFailures(g_current_test);
    if (iVar5 == iVar6) {
      DepsLog::DepsLog((DepsLog *)local_1c0);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"ninja_deps",
                 (allocator<char> *)((long)&builder.scan_.dyndep_loader_.disk_interface_ + 7));
      bVar4 = DepsLog::OpenForWrite((DepsLog *)local_1c0,&local_1e0,(string *)&manifest);
      bVar4 = testing::Test::Check
                        (pTVar1,bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x849,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&builder.scan_.dyndep_loader_.disk_interface_ + 7));
      pTVar1 = g_current_test;
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&manifest);
        bVar4 = testing::Test::Check
                          (pTVar1,bVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x84a,"\"\" == err");
        if (bVar4) {
          Builder::Builder((Builder *)local_2c0,(State *)local_140,
                           &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,
                           (BuildLog *)0x0,(DepsLog *)local_1c0,
                           &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.
                            super_DiskInterface);
          std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                    ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                     &builder.plan_.command_edges_,
                     &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                      super_CommandRunner);
          pTVar1 = g_current_test;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"out",&local_2e1);
          pNVar9 = Builder::AddTarget((Builder *)local_2c0,&local_2e0,(string *)&manifest);
          testing::Test::Check
                    (pTVar1,pNVar9 != (Node *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x84e,"builder.AddTarget(\"out\", &err)");
          std::__cxx11::string::~string((string *)&local_2e0);
          std::allocator<char>::~allocator(&local_2e1);
          pTVar1 = g_current_test;
          bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&manifest);
          bVar4 = testing::Test::Check
                            (pTVar1,bVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x84f,"\"\" == err");
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_308,"in1.d",&local_309);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_330,"out: in2",&local_331);
            VirtualFileSystem::Create
                      (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_308,&local_330
                      );
            std::__cxx11::string::~string((string *)&local_330);
            std::allocator<char>::~allocator(&local_331);
            std::__cxx11::string::~string((string *)&local_308);
            std::allocator<char>::~allocator(&local_309);
            pTVar1 = g_current_test;
            bVar3 = Builder::Build((Builder *)local_2c0,(string *)&manifest);
            testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x851,"builder.Build(&err)");
            pTVar1 = g_current_test;
            bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&manifest);
            testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x852,"\"\" == err");
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_358,"in1.d",&local_359);
            TVar8 = VirtualFileSystem::Stat
                              (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_358,
                               (string *)&manifest);
            testing::Test::Check
                      (pTVar1,TVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x855,"0 == fs_.Stat(\"in1.d\", &err)");
            std::__cxx11::string::~string((string *)&local_358);
            std::allocator<char>::~allocator(&local_359);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_380,"in1.d",&local_381);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a8,"out: in2",
                       (allocator<char> *)
                       ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            VirtualFileSystem::Create
                      (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_380,&local_3a8
                      );
            std::__cxx11::string::~string((string *)&local_3a8);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            std::__cxx11::string::~string((string *)&local_380);
            std::allocator<char>::~allocator(&local_381);
            DepsLog::Close((DepsLog *)local_1c0);
            std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                      ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                       &builder.plan_.command_edges_);
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
          }
          bVar4 = !bVar4;
          Builder::~Builder((Builder *)local_2c0);
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          bVar4 = true;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        bVar4 = true;
      }
      DepsLog::~DepsLog((DepsLog *)local_1c0);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      bVar4 = true;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    bVar4 = true;
  }
  State::~State((State *)local_140);
  if (!bVar4) {
    State::State((State *)&fail_count_3);
    local_4bc = testing::Test::AssertionFailures(g_current_test);
    StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,(State *)&fail_count_3);
    iVar5 = local_4bc;
    iVar6 = testing::Test::AssertionFailures(g_current_test);
    if (iVar5 == iVar6) {
      local_4c0 = testing::Test::AssertionFailures(g_current_test);
      ppNVar2 = state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      ManifestParserOptions::ManifestParserOptions(&local_4c8);
      AssertParse((State *)&fail_count_3,(char *)ppNVar2,local_4c8);
      iVar5 = local_4c0;
      iVar6 = testing::Test::AssertionFailures(g_current_test);
      if (iVar5 == iVar6) {
        VirtualFileSystem::Tick(&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"in2",&local_4e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_510,"",
                   (allocator<char> *)
                   ((long)&deps_log_1.deps_.
                           super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        VirtualFileSystem::Create
                  (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_4e8,&local_510);
        std::__cxx11::string::~string((string *)&local_510);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&deps_log_1.deps_.
                           super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_4e8);
        std::allocator<char>::~allocator(&local_4e9);
        DepsLog::DepsLog((DepsLog *)local_578);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_598,"ninja_deps",&local_599);
        LVar7 = DepsLog::Load((DepsLog *)local_578,&local_598,(State *)&fail_count_3,
                              (string *)&manifest);
        bVar4 = testing::Test::Check
                          (pTVar1,LVar7 != LOAD_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x867,"deps_log.Load(\"ninja_deps\", &state, &err)");
        std::__cxx11::string::~string((string *)&local_598);
        std::allocator<char>::~allocator(&local_599);
        pTVar1 = g_current_test;
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c0,"ninja_deps",
                     (allocator<char> *)((long)&builder_1.scan_.dyndep_loader_.disk_interface_ + 7))
          ;
          bVar4 = DepsLog::OpenForWrite((DepsLog *)local_578,&local_5c0,(string *)&manifest);
          bVar4 = testing::Test::Check
                            (pTVar1,bVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x868,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
          std::__cxx11::string::~string((string *)&local_5c0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&builder_1.scan_.dyndep_loader_.disk_interface_ + 7))
          ;
          if (((bVar4 ^ 0xffU) & 1) == 0) {
            Builder::Builder((Builder *)local_6a0,(State *)&fail_count_3,
                             &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,
                             (BuildLog *)0x0,(DepsLog *)local_578,
                             &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.
                              super_DiskInterface);
            std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                      ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                       &builder_1.plan_.command_edges_,
                       &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                        super_CommandRunner);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                     commands_ran_);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_6c0,"out",&local_6c1);
            pNVar9 = Builder::AddTarget((Builder *)local_6a0,&local_6c0,(string *)&manifest);
            testing::Test::Check
                      (pTVar1,pNVar9 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x86d,"builder.AddTarget(\"out\", &err)");
            std::__cxx11::string::~string((string *)&local_6c0);
            std::allocator<char>::~allocator(&local_6c1);
            pTVar1 = g_current_test;
            bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&manifest);
            bVar4 = testing::Test::Check
                              (pTVar1,bVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x86e,"\"\" == err");
            pTVar1 = g_current_test;
            if (bVar4) {
              bVar4 = Builder::Build((Builder *)local_6a0,(string *)&manifest);
              testing::Test::Check
                        (pTVar1,bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x86f,"builder.Build(&err)");
              pTVar1 = g_current_test;
              bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&manifest);
              testing::Test::Check
                        (pTVar1,bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x870,"\"\" == err");
              pTVar1 = g_current_test;
              sVar10 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                               commands_ran_);
              testing::Test::Check
                        (pTVar1,sVar10 == 1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x874,"1u == command_runner_.commands_ran_.size()");
              std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                        ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                         &builder_1.plan_.command_edges_);
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
            }
            Builder::~Builder((Builder *)local_6a0);
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
        DepsLog::~DepsLog((DepsLog *)local_578);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    State::~State((State *)&fail_count_3);
  }
  std::__cxx11::string::~string((string *)&manifest);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, Straightforward) {
  string err;
  // Note: in1 was created by the superclass SetUp().
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    fs_.Create("in1.d", "out: in2");
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // The deps file should have been removed.
    EXPECT_EQ(0, fs_.Stat("in1.d", &err));
    // Recreate it for the next step.
    fs_.Create("in1.d", "out: in2");
    deps_log.Close();
    builder.command_runner_.release();
  }

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Touch the file only mentioned in the deps.
    fs_.Tick();
    fs_.Create("in2", "");

    // Run the build again.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    command_runner_.commands_ran_.clear();
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // We should have rebuilt the output due to in2 being
    // out of date.
    EXPECT_EQ(1u, command_runner_.commands_ran_.size());

    builder.command_runner_.release();
  }
}